

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

string * cs_impl::to_string_if<std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>,false>
         ::to_string_abi_cxx11_
                   (_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*> *param_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_stack_000003e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30 [48];
  
  get_name_of_type<std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>>();
  __lhs = &local_50;
  cxx_demangle_abi_cxx11_(in_stack_000003e8);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return in_RDI;
}

Assistant:

static std::string to_string(const T &)
		{
			return "[" + cxx_demangle(get_name_of_type<T>()) + "]";
		}